

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

void leftRightProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *leftOperand,CTemp *rightOperand,bool shouldLoadLeft,bool shouldStoreLeft)

{
  iterator iVar1;
  iterator iVar2;
  _Rb_tree_header *p_Var3;
  string rightName;
  string leftName;
  undefined1 local_e1;
  string local_e0;
  int local_bc;
  shared_ptr<AssemblyCode::AssemblyCommand> local_b8;
  CTemp *local_a0;
  undefined1 local_98 [32];
  shared_ptr<AssemblyCode::AssemblyCommand> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  local_a0 = beginSP;
  local_78 = thisShared;
  if (shouldLoadLeft || shouldStoreLeft) {
    IRT::CTemp::ToString_abi_cxx11_((string *)&local_50,leftOperand);
    IRT::CTemp::ToString_abi_cxx11_((string *)&local_70,rightOperand);
    IRT::CTemp::ToString_abi_cxx11_(&local_e0,leftOperand);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&spilledToOffset->_M_t,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    IRT::CTemp::ToString_abi_cxx11_(&local_e0,rightOperand);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&spilledToOffset->_M_t,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    p_Var3 = &(spilledToOffset->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar2._M_node != p_Var3) {
      IRT::CTemp::CTemp((CTemp *)&local_e0);
      local_bc = -iVar2._M_node[2]._M_color;
      local_98._0_8_ = (MoveMemFromRegPlusConstToReg *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveMemFromRegPlusConstToReg,std::allocator<AssemblyCode::MoveMemFromRegPlusConstToReg>,IRT::CTemp&,IRT::CTemp&,int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                 (MoveMemFromRegPlusConstToReg **)local_98,
                 (allocator<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_e1,
                 (CTemp *)&local_e0,local_a0,&local_bc);
      local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_98._0_8_;
      local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)newAssemblyCommands,&local_b8);
      if (local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      IRT::CTemp::ToString_abi_cxx11_((string *)local_98,(CTemp *)&local_e0);
      std::__cxx11::string::operator=((string *)local_70._M_local_buf,(string *)local_98);
      if ((MoveMemFromRegPlusConstToReg *)local_98._0_8_ !=
          (MoveMemFromRegPlusConstToReg *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
    }
    if ((_Rb_tree_header *)iVar1._M_node == p_Var3) {
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,local_78);
    }
    else {
      IRT::CTemp::CTemp((CTemp *)&local_e0);
      if (shouldLoadLeft) {
        local_bc = -iVar1._M_node[2]._M_color;
        local_98._0_8_ = (MoveMemFromRegPlusConstToReg *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::MoveMemFromRegPlusConstToReg,std::allocator<AssemblyCode::MoveMemFromRegPlusConstToReg>,IRT::CTemp&,IRT::CTemp&,int>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                   (MoveMemFromRegPlusConstToReg **)local_98,
                   (allocator<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_e1,
                   (CTemp *)&local_e0,local_a0,&local_bc);
        local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_98._0_8_;
        local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)newAssemblyCommands,&local_b8);
        if (local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.
                     super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      IRT::CTemp::ToString_abi_cxx11_((string *)local_98,(CTemp *)&local_e0);
      std::__cxx11::string::operator=((string *)local_50._M_local_buf,(string *)local_98);
      if ((MoveMemFromRegPlusConstToReg *)local_98._0_8_ !=
          (MoveMemFromRegPlusConstToReg *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,local_78);
      if (shouldStoreLeft) {
        local_bc = -iVar1._M_node[2]._M_color;
        local_98._0_8_ = (MoveMemFromRegPlusConstToReg *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::MoveRegToMemByRegPlusConst,std::allocator<AssemblyCode::MoveRegToMemByRegPlusConst>,IRT::CTemp&,int,IRT::CTemp&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                   (MoveRegToMemByRegPlusConst **)local_98,
                   (allocator<AssemblyCode::MoveRegToMemByRegPlusConst> *)&local_e1,local_a0,
                   &local_bc,(CTemp *)&local_e0);
        local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_98._0_8_;
        local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)newAssemblyCommands,&local_b8);
        if (local_b8.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.
                     super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
    }
    IRT::CTemp::setName(leftOperand,(string *)&local_50);
    IRT::CTemp::setName(rightOperand,(string *)&local_70);
    if ((char *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
    if ((char *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    return;
  }
  __assert_fail("shouldLoadLeft || shouldStoreLeft",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/AssemblyCommand.cpp"
                ,0x1a,
                "void leftRightProcessMemoryTemps(AssemblyCommands &, std::map<std::string, int> &, IRT::CTemp &, std::shared_ptr<AssemblyCode::AssemblyCommand>, IRT::CTemp &, IRT::CTemp &, bool, bool)"
               );
}

Assistant:

void leftRightProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& leftOperand,
                                 IRT::CTemp& rightOperand,
                                 bool shouldLoadLeft = true,
                                 bool shouldStoreLeft = true) {

    assert(shouldLoadLeft || shouldStoreLeft);

    std::string leftName = leftOperand.ToString();
    std::string rightName = rightOperand.ToString();

    auto leftFind = spilledToOffset.find(leftOperand.ToString());
    auto rightFind = spilledToOffset.find(rightOperand.ToString());

    if (rightFind != spilledToOffset.end()) {
        IRT::CTemp rightTemp;
        newAssemblyCommands.push_back(createLoad(rightTemp, rightFind->second, beginSP));

        rightName = rightTemp.ToString();
    }

    if (leftFind != spilledToOffset.end()) {
        IRT::CTemp leftTemp;
        if (shouldLoadLeft) {
            newAssemblyCommands.push_back( createLoad( leftTemp, leftFind->second, beginSP ));
        }
        leftName = leftTemp.ToString( );

        newAssemblyCommands.push_back(thisShared);

        if (shouldStoreLeft) {
            newAssemblyCommands.push_back( createStore( leftTemp, leftFind->second, beginSP ));
        }
    } else {
        newAssemblyCommands.push_back(thisShared);
    }

    leftOperand.setName(leftName);
    rightOperand.setName(rightName);
}